

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

OPTIONHANDLER_HANDLE socketio_retrieveoptions(CONCRETE_IO_HANDLE handle)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  SOCKET_IO_INSTANCE *socket_io_instance;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  CONCRETE_IO_HANDLE handle_local;
  
  if (handle == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                ,"socketio_retrieveoptions",0xb0,1,"failed retrieving options (handle is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)
        OptionHandler_Create(socketio_CloneOption,socketio_DestroyOption,socketio_setoption);
    if ((OPTIONHANDLER_HANDLE)l == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"socketio_retrieveoptions",0xba,1,"unable to OptionHandler_Create");
      }
    }
    else if ((*(long *)((long)handle + 0x48) != 0) &&
            (OVar1 = OptionHandler_AddOption
                               ((OPTIONHANDLER_HANDLE)l,"net_interface_mac_address",
                                *(void **)((long)handle + 0x48)), OVar1 != OPTIONHANDLER_OK)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"socketio_retrieveoptions",0xbf,1,
                  "failed retrieving options (failed adding net_interface_mac_address)");
      }
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

static OPTIONHANDLER_HANDLE socketio_retrieveoptions(CONCRETE_IO_HANDLE handle)
{
    OPTIONHANDLER_HANDLE result;

    if (handle == NULL)
    {
        LogError("failed retrieving options (handle is NULL)");
        result = NULL;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)handle;

        result = OptionHandler_Create(socketio_CloneOption, socketio_DestroyOption, socketio_setoption);
        if (result == NULL)
        {
            LogError("unable to OptionHandler_Create");
        }
        else if (socket_io_instance->target_mac_address != NULL &&
            OptionHandler_AddOption(result, OPTION_NET_INT_MAC_ADDRESS, socket_io_instance->target_mac_address) != OPTIONHANDLER_OK)
        {
            LogError("failed retrieving options (failed adding net_interface_mac_address)");
            OptionHandler_Destroy(result);
            result = NULL;
        }
    }

    return result;
}